

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_current_seconds(asmcode *code,compiler_options *param_2)

{
  operand local_48;
  operand local_44;
  code *local_40;
  operand local_34;
  
  save_before_foreign_call(code);
  align_stack(code);
  local_48 = R15;
  local_44 = R10;
  local_40._0_4_ = ST6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_48,&local_44);
  local_40 = (code *)CONCAT44(local_40._4_4_,0x5c);
  local_48 = RAX;
  local_44 = local_48;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_48,&local_44);
  local_34 = NUMBER;
  local_40 = _skiwi_current_seconds;
  local_48 = ST6;
  local_44 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_48,&local_44,&local_34,(unsigned_long *)&local_40);
  local_40._0_4_ = 4;
  local_48 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_48);
  local_40._0_4_ = 0x40;
  local_48 = R10;
  local_44 = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_48,&local_44);
  restore_stack(code);
  restore_after_foreign_call(code);
  local_40._0_4_ = 0x55;
  local_48 = RAX;
  local_44 = NUMBER;
  local_34 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_40,&local_48,&local_44,(int *)&local_34);
  local_40 = (code *)CONCAT44(local_40._4_4_,0x2c);
  local_48 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_40,&local_48);
  return;
}

Assistant:

void compile_current_seconds(ASM::asmcode& code, const compiler_options& /*options*/)
  {
  save_before_foreign_call(code);
  align_stack(code);
  code.add(asmcode::MOV, asmcode::R15, CONTEXT); // r15 should be saved by the callee but r10 not, so we save the context in r15
#ifdef _WIN32
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, 32);
#else
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RAX);
#endif  
  code.add(asmcode::MOV, asmcode::R11, asmcode::NUMBER, (uint64_t)&_skiwi_current_seconds);
  code.add(asmcode::CALLEXTERNAL, asmcode::R11);
  code.add(asmcode::MOV, CONTEXT, asmcode::R15); // now we restore the context
  restore_stack(code);
  restore_after_foreign_call(code);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::JMP, CONTINUE);
  }